

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O1

void dumpNodeEdgesToDot(PSNode *node)

{
  long *plVar1;
  long *plVar2;
  
  plVar1 = *(long **)(node + 0x30);
  for (plVar2 = *(long **)(node + 0x28); plVar2 != plVar1; plVar2 = plVar2 + 1) {
    printf("\tNODE%u -> NODE%u [penwidth=2]\n",(ulong)*(uint *)(node + 8),
           (ulong)*(uint *)(*plVar2 + 8));
  }
  plVar1 = *(long **)(node + 0x60);
  for (plVar2 = *(long **)(node + 0x58); plVar2 != plVar1; plVar2 = plVar2 + 1) {
    printf("\tNODE%u -> NODE%u [color=blue,style=dotted,constraint=false]\n",
           (ulong)*(uint *)(*plVar2 + 8),(ulong)*(uint *)(node + 8));
  }
  if ((node != (PSNode *)0x0) && ((*(uint *)(node + 0x90) & 0xfffffffe) == 8)) {
    plVar1 = *(long **)(node + 0xf0);
    for (plVar2 = *(long **)(node + 0xe8); plVar2 != plVar1; plVar2 = plVar2 + 1) {
      printf("\tNODE%u -> NODE%u [penwidth=4,style=dashed,constraint=false]\n",
             (ulong)*(uint *)(node + 8),(ulong)*(uint *)(*(long *)(*plVar2 + 0x58) + 8));
    }
  }
  if ((node != (PSNode *)0x0) && (*(int *)(node + 0x90) == 0xc)) {
    plVar1 = *(long **)(node + 0xf0);
    for (plVar2 = *(long **)(node + 0xe8); plVar2 != plVar1; plVar2 = plVar2 + 1) {
      printf("\tNODE%u -> NODE%u [penwidth=4,style=dashed,constraint=false]\n",
             (ulong)*(uint *)(node + 8),(ulong)*(uint *)(*plVar2 + 8));
    }
  }
  return;
}

Assistant:

static void dumpNodeEdgesToDot(PSNode *node) {
    for (PSNode *succ : node->successors()) {
        printf("\tNODE%u -> NODE%u [penwidth=2]\n", node->getID(),
               succ->getID());
    }

    for (PSNode *op : node->getOperands()) {
        printf("\tNODE%u -> NODE%u "
               "[color=blue,style=dotted,constraint=false]\n",
               op->getID(), node->getID());
    }

    if (auto *C = PSNodeCall::get(node)) {
        for (auto *const subg : C->getCallees()) {
            printf("\tNODE%u -> NODE%u "
                   "[penwidth=4,style=dashed,constraint=false]\n",
                   node->getID(), subg->root->getID());
        }
    }

    if (auto *R = PSNodeRet::get(node)) {
        for (auto *const succ : R->getReturnSites()) {
            printf("\tNODE%u -> NODE%u "
                   "[penwidth=4,style=dashed,constraint=false]\n",
                   node->getID(), succ->getID());
        }
    }
}